

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedBrokerServer.cpp
# Opt level: O1

ActionMessage *
helics::apps::TypedBrokerServer::generateMessageResponse
          (ActionMessage *__return_storage_ptr__,ActionMessage *rxcmd,portData *pdata,CoreType ctype
          )

{
  action_t aVar1;
  pointer pbVar2;
  pointer pcVar3;
  byte *__src;
  size_t size;
  bool bVar4;
  uint uVar5;
  uint __val;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  char cVar13;
  uint uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  string_view brokerName;
  string_view brokerName_00;
  string_view configureString;
  string_view str;
  string_view configureString_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string brkinit;
  pair<std::shared_ptr<helics::Broker>,_bool> nbrk;
  string brkname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  shared_ptr<helics::Broker> local_a8;
  char local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  aVar1 = rxcmd->messageAction;
  if ((((aVar1 != cmd_protocol_priority) && (aVar1 != cmd_protocol_big)) && (aVar1 != cmd_protocol))
     || ((rxcmd->messageID != 0x5af && (rxcmd->messageID != 299)))) {
    ActionMessage::ActionMessage(__return_storage_ptr__,cmd_ignore);
    return __return_storage_ptr__;
  }
  __val = getOpenPort(pdata);
  if ((int)__val < 1) {
    ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
    __return_storage_ptr__->messageID = 0xed3;
    return __return_storage_ptr__;
  }
  local_70.first._M_dataplus._M_p = (pointer)&local_70.first.field_2;
  local_70.first._M_string_length = 0;
  local_70.first.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity =
       local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pbVar7 = (rxcmd->stringData).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar7 != (rxcmd->stringData).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,pbVar7
              );
  }
  pbVar2 = (rxcmd->stringData).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(rxcmd->stringData).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    uVar14 = 1;
    if (9 < __val) {
      uVar8 = __val;
      uVar5 = 4;
      do {
        uVar14 = uVar5;
        if (uVar8 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001c6b97;
        }
        if (uVar8 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001c6b97;
        }
        if (uVar8 < 10000) goto LAB_001c6b97;
        bVar4 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        uVar5 = uVar14 + 4;
      } while (bVar4);
      uVar14 = uVar14 + 1;
    }
LAB_001c6b97:
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_e8,(ulong)uVar14,'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>(local_e8._M_dataplus._M_p,uVar14,__val);
    pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_e8,0,0,"--external --localport=",0x17);
    local_108._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar9 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == paVar9) {
      local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_108._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_c8,&local_108);
    local_90.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
    _Var12._M_p = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) goto LAB_001c6d65;
  }
  else {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    pcVar3 = pbVar2[1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar3,pcVar3 + pbVar2[1]._M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_e8," --external --localport=");
    uVar14 = 1;
    if (9 < __val) {
      uVar8 = __val;
      uVar5 = 4;
      do {
        uVar14 = uVar5;
        if (uVar8 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001c6c4e;
        }
        if (uVar8 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001c6c4e;
        }
        if (uVar8 < 10000) goto LAB_001c6c4e;
        bVar4 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        uVar5 = uVar14 + 4;
      } while (bVar4);
      uVar14 = uVar14 + 1;
    }
LAB_001c6c4e:
    paVar9 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar9;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_90,(ulong)uVar14,'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>(local_90._M_dataplus._M_p,uVar14,__val);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      uVar11 = local_e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_90._M_string_length + local_e8._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar9) {
        uVar11 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_90._M_string_length + local_e8._M_string_length) goto LAB_001c6cc3;
      pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_90,0,0,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    }
    else {
LAB_001c6cc3:
      pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_e8,local_90._M_dataplus._M_p,local_90._M_string_length);
    }
    local_108._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar10 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == paVar10) {
      local_108.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_108.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_108._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar7->_M_string_length = 0;
    paVar10->_M_local_buf[0] = '\0';
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_c8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    _Var12._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar9) {
LAB_001c6d65:
      operator_delete(_Var12._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_70.first._M_string_length == (char *)0x0) {
    BrokerFactory::findJoinableBrokerOfType((CoreType)&local_108);
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
    _Var12._M_p = local_108._M_dataplus._M_p;
    local_108._M_string_length = 0;
    local_108._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      configureString_00._M_str = local_c8._M_dataplus._M_p;
      configureString_00._M_len = local_c8._M_string_length;
      BrokerFactory::create((BrokerFactory *)&local_108,ctype,configureString_00);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
      _Var12._M_p = local_108._M_dataplus._M_p;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length);
      }
      cVar13 = '\x01';
      (**(code **)(*(size_type *)_Var12._M_p + 0x10))(_Var12._M_p);
      goto LAB_001c6e6b;
    }
  }
  else {
    brokerName_00._M_str = (char *)local_70.first._M_string_length;
    brokerName_00._M_len = (size_t)&local_108;
    BrokerFactory::findBroker(brokerName_00);
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
    _Var12._M_p = local_108._M_dataplus._M_p;
    local_108._M_string_length = 0;
    local_108._M_dataplus._M_p = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      brokerName._M_len = (ulong)ctype;
      brokerName._M_str = (char *)local_70.first._M_string_length;
      configureString._M_str = (char *)local_c8._M_string_length;
      configureString._M_len = (size_t)local_70.first._M_dataplus._M_p;
      BrokerFactory::create((CoreType)&local_108,brokerName,configureString);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
      _Var12._M_p = local_108._M_dataplus._M_p;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length);
      }
      cVar13 = '\x01';
      (**(code **)(*(size_type *)_Var12._M_p + 0x10))(_Var12._M_p);
      goto LAB_001c6e6b;
    }
  }
  local_108._M_string_length = 0;
  local_108._M_dataplus._M_p = (pointer)0x0;
  cVar13 = '\0';
  this_00 = this;
LAB_001c6e6b:
  local_a8.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var12._M_p;
  local_a8.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_00;
  local_98 = cVar13;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  paVar15 = &local_70.first.field_2;
  paVar9 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar9) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_70.first._M_dataplus._M_p,
                    CONCAT71(local_70.first.field_2._M_allocated_capacity._1_7_,
                             local_70.first.field_2._M_local_buf[0]) + 1);
  }
  if (local_98 == '\x01') {
    assignPort(pdata,__val,&local_a8);
  }
  ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
  __return_storage_ptr__->messageID = 0x14d;
  iVar6 = (**(code **)(*(size_type *)
                        local_a8.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x58))();
  __src = *(byte **)CONCAT44(extraout_var,iVar6);
  size = ((undefined8 *)CONCAT44(extraout_var,iVar6))[1];
  if ((__return_storage_ptr__->payload).heap == __src) {
    (__return_storage_ptr__->payload).bufferSize = size;
  }
  else {
    SmallBuffer::reserve(&__return_storage_ptr__->payload,size);
    (__return_storage_ptr__->payload).bufferSize = size;
    if (size != 0) {
      memcpy((__return_storage_ptr__->payload).heap,__src,size);
    }
  }
  iVar6 = (**(code **)(*(size_type *)
                        local_a8.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))();
  gmlc::networking::extractInterfaceAndPortString
            (&local_70,(string *)CONCAT44(extraout_var_00,iVar6));
  local_108._M_string_length = 2;
  local_108.field_2._M_allocated_capacity._0_3_ = 0x3a3f;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  pbVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_108,local_70.second._M_dataplus._M_p,local_70.second._M_string_length);
  local_c8._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p == paVar10) {
    local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_c8._M_dataplus._M_p = (pointer)paVar9;
  }
  else {
    local_c8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_c8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  str._M_str = local_c8._M_dataplus._M_p;
  str._M_len = local_c8._M_string_length;
  ActionMessage::setString(__return_storage_ptr__,0,str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar9) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
    operator_delete(local_70.second._M_dataplus._M_p,
                    local_70.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar15) {
    operator_delete(local_70.first._M_dataplus._M_p,
                    CONCAT71(local_70.first.field_2._M_allocated_capacity._1_7_,
                             local_70.first.field_2._M_local_buf[0]) + 1);
  }
  if (local_a8.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

ActionMessage TypedBrokerServer::generateMessageResponse(const ActionMessage& rxcmd,
                                                         portData& pdata,
                                                         CoreType ctype)
{
    //   std::cout << "received data length " << msg.size () << std::endl;
    switch (rxcmd.action()) {
        case CMD_PROTOCOL:
        case CMD_PROTOCOL_PRIORITY:
        case CMD_PROTOCOL_BIG:
            switch (rxcmd.messageID) {
                case REQUEST_PORTS:
                case CONNECTION_INFORMATION: {
                    auto pt = getOpenPort(pdata);
                    if (pt > 0) {
                        auto nbrk = findBroker(rxcmd, ctype, pt);
                        if (nbrk.second) {
                            assignPort(pdata, pt, nbrk.first);
                        }
                        return generatePortRequestReply(rxcmd, nbrk.first);
                    }
                    ActionMessage rep(CMD_PROTOCOL);
                    rep.messageID = DELAY_CONNECTION;
                    return rep;
                } break;
            }
            break;
        default:
            // std::cout << "received unknown message " << msg.size() << std::endl;
            // repSocket.send("ignored");
            break;
    }
    return CMD_IGNORE;
}